

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
          (DictionaryValue_KeyValuePair *this,DictionaryValue_KeyValuePair *from)

{
  bool bVar1;
  Value *pVVar2;
  DictionaryValue_KeyValuePair *from_local;
  DictionaryValue_KeyValuePair *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__DictionaryValue_KeyValuePair_006f0ac0;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_key(from);
  if (bVar1) {
    pVVar2 = (Value *)operator_new(0x30);
    Value::Value(pVVar2,from->key_);
    this->key_ = pVVar2;
  }
  else {
    this->key_ = (Value *)0x0;
  }
  bVar1 = _internal_has_value(from);
  if (bVar1) {
    pVVar2 = (Value *)operator_new(0x30);
    Value::Value(pVVar2,from->value_);
    this->value_ = pVVar2;
  }
  else {
    this->value_ = (Value *)0x0;
  }
  return;
}

Assistant:

DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair(const DictionaryValue_KeyValuePair& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_key()) {
    key_ = new ::CoreML::Specification::MILSpec::Value(*from.key_);
  } else {
    key_ = nullptr;
  }
  if (from._internal_has_value()) {
    value_ = new ::CoreML::Specification::MILSpec::Value(*from.value_);
  } else {
    value_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
}